

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11VulkanPlatform.cpp
# Opt level: O2

void __thiscall tcu::x11::VulkanPlatform::describePlatform(VulkanPlatform *this,ostream *dst)

{
  int iVar1;
  ostream *poVar2;
  runtime_error *this_00;
  utsname sysInfo;
  
  memset((utsname *)&sysInfo,0,0x186);
  iVar1 = uname((utsname *)&sysInfo);
  if (iVar1 == 0) {
    poVar2 = std::operator<<(dst,"OS: ");
    poVar2 = std::operator<<(poVar2,sysInfo.sysname);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,sysInfo.release);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,sysInfo.version);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(dst,"CPU: ");
    poVar2 = std::operator<<(poVar2,sysInfo.machine);
    std::operator<<(poVar2,"\n");
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"uname() failed");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void VulkanPlatform::describePlatform (std::ostream& dst) const
{
	utsname		sysInfo;
	deMemset(&sysInfo, 0, sizeof(sysInfo));

	if (uname(&sysInfo) != 0)
		throw std::runtime_error("uname() failed");

	dst << "OS: " << sysInfo.sysname << " " << sysInfo.release << " " << sysInfo.version << "\n";
	dst << "CPU: " << sysInfo.machine << "\n";
}